

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void flatbuffers::php::PhpGenerator::GetUByte(FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  ConvertCase(&local_48,(string *)field,kUpperCamel,kSnake);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_short>(&local_48,(field->value).offset);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  return;
}

Assistant:

static void GetUByte(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @return string\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel) + "Bytes()\n";
    code += Indent + "{\n";
    code += Indent + Indent + "return $this->__vector_as_bytes(";
    code += NumToString(field.value.offset) + ");\n";
    code += Indent + "}\n\n";
  }